

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeLiteral(ParsedPatternInfo *this,UErrorCode *status)

{
  ParserState *this_00;
  UChar32 UVar1;
  uint uVar2;
  
  this_00 = &this->state;
  UVar1 = ParserState::peek(this_00);
  if (UVar1 == -1) {
LAB_00266158:
    *status = U_PATTERN_SYNTAX_ERROR;
  }
  else {
    UVar1 = ParserState::peek(this_00);
    uVar2 = ParserState::peek(this_00);
    (this->state).offset = ((this->state).offset - (uint)(uVar2 < 0x10000)) + 2;
    if (UVar1 == 0x27) {
      while( true ) {
        UVar1 = ParserState::peek(this_00);
        if (UVar1 == 0x27) break;
        UVar1 = ParserState::peek(this_00);
        if (UVar1 == -1) goto LAB_00266158;
        uVar2 = ParserState::peek(this_00);
        (this->state).offset = ((this->state).offset - (uint)(uVar2 < 0x10000)) + 2;
      }
      uVar2 = ParserState::peek(this_00);
      (this->state).offset = ((this->state).offset - (uint)(uVar2 < 0x10000)) + 2;
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeLiteral(UErrorCode& status) {
    if (state.peek() == -1) {
        state.toParseException(u"Expected unquoted literal but found EOL");
        status = U_PATTERN_SYNTAX_ERROR;
        return;
    } else if (state.peek() == u'\'') {
        state.next(); // consume the starting quote
        while (state.peek() != u'\'') {
            if (state.peek() == -1) {
                state.toParseException(u"Expected quoted literal but found EOL");
                status = U_PATTERN_SYNTAX_ERROR;
                return;
            } else {
                state.next(); // consume a quoted character
            }
        }
        state.next(); // consume the ending quote
    } else {
        // consume a non-quoted literal character
        state.next();
    }
}